

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O0

exr_result_t
exr_attr_opaquedata_set_packed(exr_context_t ctxt,exr_attr_opaquedata_t *u,void *packed,int32_t sz)

{
  long lVar1;
  int in_ECX;
  void *in_RDX;
  int *in_RSI;
  long in_RDI;
  _internal_exr_context *pctxt;
  void *nmem;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RSI == (int *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
  }
  else if (in_ECX < 0) {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,3,"Opaque data given invalid negative size (%d)",in_ECX);
  }
  else {
    lVar1 = (**(code **)(in_RDI + 0x58))((long)in_ECX);
    if (lVar1 == 0) {
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
    }
    else {
      if ((*(long *)(in_RSI + 6) != 0) && (*(long *)(in_RSI + 0xc) != 0)) {
        (**(code **)(in_RSI + 0xc))(in_RDI,*(undefined8 *)(in_RSI + 6),in_RSI[1]);
      }
      in_RSI[6] = 0;
      in_RSI[7] = 0;
      in_RSI[1] = 0;
      if (*(long *)(in_RSI + 4) != 0) {
        if (0 < in_RSI[2]) {
          (**(code **)(in_RDI + 0x60))(*(undefined8 *)(in_RSI + 4));
        }
        in_RSI[4] = 0;
        in_RSI[5] = 0;
        *in_RSI = 0;
        in_RSI[2] = 0;
      }
      *(long *)(in_RSI + 4) = lVar1;
      *in_RSI = in_ECX;
      in_RSI[2] = in_ECX;
      if (in_RDX != (void *)0x0) {
        memcpy(*(void **)(in_RSI + 4),in_RDX,(long)in_ECX);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_opaquedata_set_packed (
    exr_context_t          ctxt,
    exr_attr_opaquedata_t* u,
    const void*            packed,
    int32_t                sz)
{
    void* nmem;
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!u) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    /* TODO: do we care if the incoming unpacked data is null? */
    if (sz < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Opaque data given invalid negative size (%d)",
            sz);

    nmem = pctxt->alloc_fn ((size_t) sz);
    if (!nmem) return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);

    if (u->unpacked_data)
    {
        if (u->destroy_unpacked_func_ptr)
            u->destroy_unpacked_func_ptr (
                ctxt, u->unpacked_data, u->unpacked_size);
    }
    u->unpacked_data = NULL;
    u->unpacked_size = 0;

    if (u->packed_data)
    {
        if (u->packed_alloc_size > 0) pctxt->free_fn (u->packed_data);
        u->packed_data       = NULL;
        u->size              = 0;
        u->packed_alloc_size = 0;
    }

    u->packed_data       = nmem;
    u->size              = sz;
    u->packed_alloc_size = sz;
    if (packed) memcpy ((void*) u->packed_data, packed, (size_t) sz);

    return EXR_ERR_SUCCESS;
}